

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O0

string * google::protobuf::compiler::java::AnnotationFileName<google::protobuf::ServiceDescriptor>
                   (string *__return_storage_ptr__,ServiceDescriptor *descriptor,string *suffix)

{
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *suffix_local;
  ServiceDescriptor *descriptor_local;
  
  local_20 = suffix;
  suffix_local = (string *)descriptor;
  descriptor_local = (ServiceDescriptor *)__return_storage_ptr__;
  __lhs = ServiceDescriptor::name_abi_cxx11_(descriptor);
  std::operator+(&local_40,__lhs,local_20);
  std::operator+(__return_storage_ptr__,&local_40,".java.pb.meta");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string AnnotationFileName(const Descriptor* descriptor, const string& suffix) {
  return descriptor->name() + suffix + ".java.pb.meta";
}